

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Labels.cpp
# Opt level: O2

int __thiscall Labels::update(Labels *this)

{
  bool bVar1;
  ostream *poVar2;
  int iVar3;
  uint i;
  ulong uVar4;
  
  if (DebugFlag) {
    bVar1 = isCurrentDebugType("labels");
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"update");
      poVar2 = std::operator<<(poVar2,": ");
      poVar2 = std::operator<<(poVar2,"current size: ");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::endl<char,std::char_traits<char>>(poVar2);
    }
  }
  iVar3 = 0;
  for (uVar4 = 0; uVar4 < current_size; uVar4 = uVar4 + 1) {
    if (labels_activated[uVar4] == true) {
      this->labels_counter[uVar4] = this->labels_counter[uVar4] + 1;
      iVar3 = iVar3 + 1;
    }
    if (DebugFlag == true) {
      bVar1 = isCurrentDebugType("labels");
      if (bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"update");
        poVar2 = std::operator<<(poVar2,": ");
        poVar2 = std::operator<<(poVar2,"activated[");
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        poVar2 = std::operator<<(poVar2,"] ? ");
        poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
        poVar2 = std::operator<<(poVar2," counter? ");
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        std::endl<char,std::char_traits<char>>(poVar2);
      }
    }
  }
  if (DebugFlag != false) {
    bVar1 = isCurrentDebugType("info");
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"update");
      poVar2 = std::operator<<(poVar2,": ");
      poVar2 = std::operator<<(poVar2,"ENDING");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
  }
  return iVar3;
}

Assistant:

int Labels::update(){
    // For each activated labels, increase counter.
    int cnt = 0;
    DEBUGG("labels", "current size: " << current_size);
    for(unsigned int i=0 ; i<current_size ; i++){
        if(labels_activated[i]){
            labels_counter[i]++;
            cnt++;
        }
        DEBUGG("labels","activated["<<
                i << "] ? "<< labels_activated[i]<<
                " counter? "<<labels_counter[i]);
    }
    DEBUGINFO("ENDING");
    return cnt;
}